

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O3

bool __thiscall irr::gui::CGUIScrollBar::OnEvent(CGUIScrollBar *this,SEvent *event)

{
  f32 *pfVar1;
  EEVENT_TYPE EVar2;
  EGUI_EVENT_TYPE EVar3;
  IGUIElement *pIVar4;
  long *plVar5;
  char cVar6;
  undefined1 uVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  s32 sVar11;
  int iVar12;
  int iVar13;
  SEvent newEvent;
  SSystemEvent local_68;
  undefined4 local_60;
  CGUIScrollBar *local_58;
  undefined8 local_50;
  undefined4 local_48;
  
  cVar6 = (**(code **)(*(long *)this + 0x90))();
  if (cVar6 == '\0') goto switchD_002219ab_caseD_1;
  EVar2 = event->EventType;
  if (EVar2 == EET_GUI_EVENT) {
    EVar3 = (event->field_1).GUIEvent.EventType;
    if (EVar3 == EGET_ELEMENT_FOCUS_LOST) {
      if ((CGUIScrollBar *)(event->field_1).GUIEvent.Caller == this) {
        this->Dragging = false;
      }
    }
    else if (EVar3 == EGET_BUTTON_CLICKED) {
      pIVar4 = (event->field_1).GUIEvent.Caller;
      if (pIVar4 == &this->UpButton->super_IGUIElement) {
        iVar12 = this->Pos - this->SmallStep;
      }
      else {
        if (pIVar4 != &this->DownButton->super_IGUIElement) goto LAB_00221b0e;
        iVar12 = this->SmallStep + this->Pos;
      }
LAB_00221b02:
      (**(code **)(*(long *)this + 0x168))(this,iVar12);
LAB_00221b0e:
      local_60 = 0;
      local_50 = 0;
      local_48 = 6;
      local_58 = this;
      (**(code **)(**(long **)&this->field_0x20 + 0x10))();
      return true;
    }
    goto switchD_002219ab_caseD_1;
  }
  if (EVar2 == EET_MOUSE_INPUT_EVENT) {
    local_68 = (event->field_1).SystemEvent;
    cVar6 = (**(code **)(*(long *)this + 0x28))(this);
    switch((event->field_1).MouseInput.Event) {
    case EMIE_LMOUSE_PRESSED_DOWN:
      if (cVar6 != '\0') {
        this->Dragging = true;
        if ((int)local_68.EventType < (this->SliderRect).UpperLeftCorner.X) {
          bVar8 = false;
        }
        else {
          bVar8 = false;
          if (((this->SliderRect).UpperLeftCorner.Y <= (int)local_68.field_1) &&
             ((int)local_68.EventType <= (this->SliderRect).LowerRightCorner.X)) {
            bVar8 = (int)local_68.field_1 <= (this->SliderRect).LowerRightCorner.Y;
          }
        }
        this->DraggedBySlider = bVar8;
        this->TrayClick = (bool)(bVar8 ^ 1);
        sVar11 = getPosFromMousePos(this,(position2di *)&local_68);
        this->DesiredPos = sVar11;
        return true;
      }
      break;
    case EMIE_LMOUSE_LEFT_UP:
    case EMIE_MOUSE_MOVED:
      if (((event->field_1).field13[0x10] & 1) == 0) {
        this->Dragging = false;
      }
      else if ((this->Dragging & 1U) != 0) {
        if ((event->field_1).MouseInput.Event == EMIE_LMOUSE_LEFT_UP) {
          this->Dragging = false;
        }
        sVar11 = getPosFromMousePos(this,(position2di *)&local_68);
        iVar12 = this->Pos;
        bVar9 = this->DraggedBySlider;
        if ((bool)bVar9 == false) {
          bVar8 = false;
          if (cVar6 != '\0') {
            if ((int)local_68.EventType < (this->SliderRect).UpperLeftCorner.X) {
              bVar8 = false;
            }
            else {
              bVar8 = false;
              if (((this->SliderRect).UpperLeftCorner.Y <= (int)local_68.field_1) &&
                 ((int)local_68.EventType <= (this->SliderRect).LowerRightCorner.X)) {
                bVar8 = (int)local_68.field_1 <= (this->SliderRect).LowerRightCorner.Y;
              }
            }
            this->DraggedBySlider = bVar8;
            this->TrayClick = (bool)(bVar8 ^ 1);
          }
          if (bVar8 == false) {
            this->TrayClick = false;
            bVar9 = 0;
            if ((event->field_1).MouseInput.Event == EMIE_MOUSE_MOVED) {
              return (bool)cVar6;
            }
          }
          else {
            (**(code **)(*(long *)this + 0x168))(this,sVar11);
            bVar9 = this->DraggedBySlider;
          }
        }
        if ((bVar9 & 1) == 0) {
          this->DesiredPos = sVar11;
        }
        else {
          (**(code **)(*(long *)this + 0x168))(this,sVar11);
        }
        if (this->Pos != iVar12) {
          if (*(long **)&this->field_0x20 != (long *)0x0) {
            local_60 = 0;
            local_50 = 0;
            local_48 = 6;
            local_58 = this;
            (**(code **)(**(long **)&this->field_0x20 + 0x10))();
            return (bool)cVar6;
          }
          return (bool)cVar6;
        }
        return (bool)cVar6;
      }
      if ((event->field_1).MouseInput.Event != EMIE_MOUSE_MOVED) {
        return (bool)cVar6;
      }
      break;
    case EMIE_MOUSE_WHEEL:
      cVar6 = (**(code **)(**(long **)&this->field_0x128 + 0x28))
                        (*(long **)&this->field_0x128,this,0);
      if (cVar6 != '\0') {
        iVar10 = (**(code **)(*(long *)this + 0x160))(this);
        pfVar1 = &(event->field_1).MouseInput.Wheel;
        iVar13 = -this->SmallStep;
        if (0.0 < (float)*pfVar1 || (float)*pfVar1 == 0.0) {
          iVar13 = this->SmallStep;
        }
        iVar12 = -iVar13;
        if (this->Horizontal != false) {
          iVar12 = iVar13;
        }
        iVar12 = iVar12 + iVar10;
        goto LAB_00221b02;
      }
    }
    goto switchD_002219ab_caseD_1;
  }
  if ((EVar2 != EET_KEY_INPUT_EVENT) || (((event->field_1).field13[0xc] & 1) == 0))
  goto switchD_002219ab_caseD_1;
  iVar12 = this->Pos;
  switch((event->field_1).MouseInput.Y) {
  case 0x21:
    iVar13 = iVar12 - this->LargeStep;
    break;
  case 0x22:
    iVar13 = this->LargeStep;
    goto LAB_00221b66;
  case 0x23:
    iVar13 = this->Max;
    break;
  case 0x24:
    iVar13 = this->Min;
    break;
  case 0x25:
  case 0x26:
    iVar13 = iVar12 - this->SmallStep;
    break;
  case 0x27:
  case 0x28:
    iVar13 = this->SmallStep;
LAB_00221b66:
    iVar13 = iVar13 + iVar12;
    break;
  default:
    bVar8 = true;
    goto LAB_00221b77;
  }
  (**(code **)(*(long *)this + 0x168))(this,iVar13);
  bVar8 = false;
LAB_00221b77:
  if (this->Pos != iVar12) {
    local_60 = 0;
    local_50 = 0;
    local_48 = 6;
    local_58 = this;
    (**(code **)(**(long **)&this->field_0x20 + 0x10))();
  }
  uVar7 = 1;
  if (bVar8) {
switchD_002219ab_caseD_1:
    plVar5 = *(long **)&this->field_0x20;
    if (plVar5 == (long *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (**(code **)(*plVar5 + 0x10))(plVar5,event);
    }
  }
  return (bool)uVar7;
}

Assistant:

bool CGUIScrollBar::OnEvent(const SEvent &event)
{
	if (isEnabled()) {

		switch (event.EventType) {
		case EET_KEY_INPUT_EVENT:
			if (event.KeyInput.PressedDown) {
				const s32 oldPos = Pos;
				bool absorb = true;
				switch (event.KeyInput.Key) {
				case KEY_LEFT:
				case KEY_UP:
					setPos(Pos - SmallStep);
					break;
				case KEY_RIGHT:
				case KEY_DOWN:
					setPos(Pos + SmallStep);
					break;
				case KEY_HOME:
					setPos(Min);
					break;
				case KEY_PRIOR:
					setPos(Pos - LargeStep);
					break;
				case KEY_END:
					setPos(Max);
					break;
				case KEY_NEXT:
					setPos(Pos + LargeStep);
					break;
				default:
					absorb = false;
				}

				if (Pos != oldPos) {
					SEvent newEvent;
					newEvent.EventType = EET_GUI_EVENT;
					newEvent.GUIEvent.Caller = this;
					newEvent.GUIEvent.Element = 0;
					newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
					Parent->OnEvent(newEvent);
				}
				if (absorb)
					return true;
			}
			break;
		case EET_GUI_EVENT:
			if (event.GUIEvent.EventType == EGET_BUTTON_CLICKED) {
				if (event.GUIEvent.Caller == UpButton)
					setPos(Pos - SmallStep);
				else if (event.GUIEvent.Caller == DownButton)
					setPos(Pos + SmallStep);

				SEvent newEvent;
				newEvent.EventType = EET_GUI_EVENT;
				newEvent.GUIEvent.Caller = this;
				newEvent.GUIEvent.Element = 0;
				newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
				Parent->OnEvent(newEvent);

				return true;
			} else if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) {
				if (event.GUIEvent.Caller == this)
					Dragging = false;
			}
			break;
		case EET_MOUSE_INPUT_EVENT: {
			const core::position2di p(event.MouseInput.X, event.MouseInput.Y);
			bool isInside = isPointInside(p);
			switch (event.MouseInput.Event) {
			case EMIE_MOUSE_WHEEL:
				if (Environment->hasFocus(this)) {
					// thanks to a bug report by REAPER
					// thanks to tommi by tommi for another bugfix
					// everybody needs a little thanking. hallo niko!;-)
					setPos(getPos() +
							((event.MouseInput.Wheel < 0 ? -1 : 1) * SmallStep * (Horizontal ? 1 : -1)));

					SEvent newEvent;
					newEvent.EventType = EET_GUI_EVENT;
					newEvent.GUIEvent.Caller = this;
					newEvent.GUIEvent.Element = 0;
					newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
					Parent->OnEvent(newEvent);
					return true;
				}
				break;
			case EMIE_LMOUSE_PRESSED_DOWN: {
				if (isInside) {
					Dragging = true;
					DraggedBySlider = SliderRect.isPointInside(p);
					TrayClick = !DraggedBySlider;
					DesiredPos = getPosFromMousePos(p);
					return true;
				}
				break;
			}
			case EMIE_LMOUSE_LEFT_UP:
			case EMIE_MOUSE_MOVED: {
				if (!event.MouseInput.isLeftPressed())
					Dragging = false;

				if (!Dragging) {
					if (event.MouseInput.Event == EMIE_MOUSE_MOVED)
						break;
					return isInside;
				}

				if (event.MouseInput.Event == EMIE_LMOUSE_LEFT_UP)
					Dragging = false;

				const s32 newPos = getPosFromMousePos(p);
				const s32 oldPos = Pos;

				if (!DraggedBySlider) {
					if (isInside) {
						DraggedBySlider = SliderRect.isPointInside(p);
						TrayClick = !DraggedBySlider;
					}

					if (DraggedBySlider) {
						setPos(newPos);
					} else {
						TrayClick = false;
						if (event.MouseInput.Event == EMIE_MOUSE_MOVED)
							return isInside;
					}
				}

				if (DraggedBySlider) {
					setPos(newPos);
				} else {
					DesiredPos = newPos;
				}

				if (Pos != oldPos && Parent) {
					SEvent newEvent;
					newEvent.EventType = EET_GUI_EVENT;
					newEvent.GUIEvent.Caller = this;
					newEvent.GUIEvent.Element = 0;
					newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
					Parent->OnEvent(newEvent);
				}
				return isInside;
			} break;

			default:
				break;
			}
		} break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}